

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

void __thiscall
llvm::function_ref<void_(llvm::Error)>::operator()
          (function_ref<void_(llvm::Error)> *this,Error *params)

{
  _func_void_intptr_t_Error *p_Var1;
  intptr_t iVar2;
  Error local_20;
  Error *local_18;
  Error *params_local;
  function_ref<void_(llvm::Error)> *this_local;
  
  p_Var1 = this->callback;
  iVar2 = this->callable;
  local_18 = params;
  params_local = (Error *)this;
  Error::Error(&local_20,params);
  (*p_Var1)(iVar2,(ErrorInfoBase *)&local_20);
  Error::~Error(&local_20);
  return;
}

Assistant:

Ret operator()(Params ...params) const {
    return callback(callable, std::forward<Params>(params)...);
  }